

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O1

Lhs * __thiscall
Lib::
SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
::pop(Lhs *__return_storage_ptr__,
     SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
     *this)

{
  uint uVar1;
  undefined4 uVar2;
  Clause *pCVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  Node *pNVar8;
  void **head;
  SelectedSummand local_48;
  
  pCVar3 = (Clause *)this->_left->nodes[0];
  uVar1 = this->_top;
  uVar5 = 1;
  uVar6 = uVar5;
  if (1 < uVar1) {
    pNVar8 = this->_left + 1;
    do {
      uVar6 = uVar5;
      if ((pNVar8->value).super_SelectedSummand.super_SelectedLiteral.cl != pCVar3) break;
      uVar5 = uVar5 + 1;
      pNVar8 = (Node *)&(pNVar8->value).super_SelectedSummand.super_SelectedLiteral.litIdx;
      uVar6 = uVar1;
    } while (uVar1 != uVar5);
  }
  uVar7 = 0;
  do {
    this->_left->nodes[uVar7] = (Node *)pCVar3->_literals[uVar7 + 0xfffffffffffffff8];
    uVar7 = uVar7 + 1;
  } while (uVar6 != uVar7);
  local_48.super_SelectedLiteral.litIdx = *(uint *)&(pCVar3->super_Unit)._inference.field_0x0;
  local_48.super_SelectedLiteral.cl =
       (((SelectedSummand *)&(pCVar3->super_Unit)._number)->super_SelectedLiteral).cl;
  local_48.super_SelectedLiteral.interpreted.
  super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ._isSome = (((Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                *)&(pCVar3->super_Unit)._inference.field_0x4)->
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             )._isSome;
  if (local_48.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._isSome == true) {
    local_48.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._21_7_ = 0;
    local_48.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._0_5_ =
         *(uint5 *)&((MaybeUninit<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      *)&(pCVar3->super_Unit)._inference.field_0x8)->_elem & 0xffffffff03;
    local_48.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._5_3_ = 0;
    uVar4 = *(undefined8 *)((long)&(pCVar3->super_Unit)._inference._splits + 1);
    local_48.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._9_3_ = (undefined3)uVar4;
    local_48.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._8_4_ =
         (uint)(uint3)local_48.super_SelectedLiteral.interpreted.
                      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      ._elem._elem._9_3_ << 8;
    local_48.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._12_4_ = (undefined4)((ulong)uVar4 >> 0x18);
    local_48.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0xf] = (char)((ulong)uVar4 >> 0x38);
    uVar2 = *(undefined4 *)((long)&(pCVar3->super_Unit)._inference._ptr1 + 1);
    local_48.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._17_3_ = (undefined3)uVar2;
    local_48.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0x13] = (char)((uint)uVar2 >> 0x18);
  }
  local_48.super_SelectedLiteral._44_4_ =
       *(undefined4 *)((long)&(pCVar3->super_Unit)._inference._ptr2 + 4);
  Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs(__return_storage_ptr__,&local_48);
  if (pCVar3 != (Clause *)0x0) {
    uVar7 = (ulong)(uVar6 - 1) * 8 + 0x47 & 0xfffffffffffffff0;
    if (uVar7 == 0) {
      (((SelectedSummand *)&(pCVar3->super_Unit)._number)->super_SelectedLiteral).cl =
           (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pCVar3;
    }
    else if (uVar7 < 0x11) {
      (((SelectedSummand *)&(pCVar3->super_Unit)._number)->super_SelectedLiteral).cl =
           (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pCVar3;
    }
    else if (uVar7 < 0x19) {
      (((SelectedSummand *)&(pCVar3->super_Unit)._number)->super_SelectedLiteral).cl =
           (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pCVar3;
    }
    else if (uVar7 < 0x21) {
      (((SelectedSummand *)&(pCVar3->super_Unit)._number)->super_SelectedLiteral).cl =
           (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pCVar3;
    }
    else if (uVar7 < 0x31) {
      (((SelectedSummand *)&(pCVar3->super_Unit)._number)->super_SelectedLiteral).cl =
           (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pCVar3;
    }
    else if (uVar7 < 0x41) {
      (((SelectedSummand *)&(pCVar3->super_Unit)._number)->super_SelectedLiteral).cl =
           (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pCVar3;
    }
    else {
      operator_delete(pCVar3,0x10);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value pop()
  {
    ASS(isNonEmpty());

    // find the height of the first
    Node* node = _left->nodes[0];
    unsigned h;
    for (h = 1;h < _top;h++) {
      if (_left->nodes[h] != node) {
	break;
      }
    }
    // the height of the first node is h-1
    for (unsigned i = 0;i < h;i++) {
      _left->nodes[i] = node->nodes[i];
    }
    Value val = node->value;
    deallocate(node,h-1);
    return val;
  }